

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O2

void __thiscall wasm::DataFlowOpts::replaceAllUsesWith(DataFlowOpts *this,Node *node,Node *with)

{
  Users *this_00;
  Type TVar1;
  Index index;
  pointer ppNVar2;
  Expression *expr;
  pointer puVar3;
  UserSet *pUVar4;
  __node_base *p_Var5;
  Expression *pEVar6;
  Expression **ppEVar7;
  ulong uVar8;
  iterator __begin4;
  undefined1 auVar9 [8];
  iterator __end4;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Node *local_40;
  Node *user;
  
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((with->type == Expr) && (((with->field_1).expr)->_id == ConstId)) {
    this_00 = &this->nodeUsers;
    pUVar4 = DataFlow::Users::getUsers(this_00,node);
    p_Var5 = &(pUVar4->_M_h)._M_before_begin;
    while( true ) {
      p_Var5 = p_Var5->_M_nxt;
      if (p_Var5 == (__node_base *)0x0) {
        DataFlow::Users::removeAllUsesOf(this_00,node);
        return;
      }
      local_40 = *(Node **)(p_Var5 + 1);
      std::__detail::
      _Insert_base<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->workLeft,&local_40);
      DataFlow::Users::addUser(this_00,with,local_40);
      auStack_68 = (undefined1  [8])0x0;
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      user._4_4_ = 0;
      while( true ) {
        puVar3 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)user._4_4_;
        ppNVar2 = (local_40->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_40->values).
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3) <= uVar8)
        break;
        if (ppNVar2[uVar8] == node) {
          ppNVar2[uVar8] = with;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
                     (value_type_conflict2 *)((long)&user + 4));
        }
        user._4_4_ = user._4_4_ + 1;
      }
      if (auStack_68 ==
          (undefined1  [8])
          indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) break;
      TVar1 = local_40->type;
      if ((1 < TVar1 - Phi) && (TVar1 != Zext)) {
        if (TVar1 != Expr) {
          handle_unreachable("unexpected dataflow node type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                             ,0xdc);
        }
        expr = (local_40->field_1).expr;
        for (auVar9 = auStack_68; auVar9 != (undefined1  [8])puVar3;
            auVar9 = (undefined1  [8])((long)auVar9 + 4)) {
          index = *(Index *)auVar9;
          pEVar6 = DataFlow::Graph::makeUse(&this->graph,with);
          ppEVar7 = getIndexPointer((DataFlowOpts *)
                                    indexes.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,expr,index);
          *ppEVar7 = pEVar6;
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
    }
    __assert_fail("!indexes.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                  ,0xbd,
                  "void wasm::DataFlowOpts::replaceAllUsesWith(DataFlow::Node *, DataFlow::Node *)")
    ;
  }
  __assert_fail("with->isConst()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                ,0xac,
                "void wasm::DataFlowOpts::replaceAllUsesWith(DataFlow::Node *, DataFlow::Node *)");
}

Assistant:

void replaceAllUsesWith(DataFlow::Node* node, DataFlow::Node* with) {
    // Const nodes are trivial to replace, but other stuff is trickier -
    // in particular phis.
    assert(with->isConst()); // TODO
    // All the users should be worked on later, as we will update them.
    auto& users = nodeUsers.getUsers(node);
    for (auto* user : users) {
      // Add the user to the work left to do, as we are modifying it.
      workLeft.insert(user);
      // `with` is getting another user.
      nodeUsers.addUser(with, user);
      // Replacing in the DataFlow IR is simple - just replace it,
      // in all the indexes it appears.
      std::vector<Index> indexes;
      for (Index i = 0; i < user->values.size(); i++) {
        if (user->values[i] == node) {
          user->values[i] = with;
          indexes.push_back(i);
        }
      }
      assert(!indexes.empty());
      // Replacing in the Binaryen IR requires more care
      switch (user->type) {
        case DataFlow::Node::Type::Expr: {
          auto* expr = user->expr;
          for (auto index : indexes) {
            *(getIndexPointer(expr, index)) = graph.makeUse(with);
          }
          break;
        }
        case DataFlow::Node::Type::Phi: {
          // Nothing to do: a phi is not in the Binaryen IR.
          // If the entire phi can become a constant, that will be
          // propagated when we process that phi later.
          break;
        }
        case DataFlow::Node::Type::Cond: {
          // Nothing to do: a cond is not in the Binaryen IR.
          // If the cond input is a constant, that might indicate
          // useful optimizations are possible, which perhaps we
          // should look into TODO
          break;
        }
        case DataFlow::Node::Type::Zext: {
          // Nothing to do: a zext is not in the Binaryen IR.
          // If the cond input is a constant, that might indicate
          // useful optimizations are possible, which perhaps we
          // should look into TODO
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected dataflow node type");
      }
    }
    // No one is a user of this node after we replaced all the uses.
    nodeUsers.removeAllUsesOf(node);
  }